

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

size_t bssl::dtls_max_seal_overhead(SSL *ssl,uint16_t epoch)

{
  bool bVar1;
  DTLSWriteEpoch *pDVar2;
  size_t sVar3;
  pointer this;
  size_t sVar4;
  SSL *local_30;
  size_t ret;
  DTLSWriteEpoch *write_epoch;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  pDVar2 = dtls_get_write_epoch(ssl,epoch);
  if (pDVar2 == (DTLSWriteEpoch *)0x0) {
    ssl_local = (SSL *)0x0;
  }
  else {
    sVar3 = dtls_record_header_write_len(ssl,epoch);
    this = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->(&pDVar2->aead)
    ;
    sVar4 = SSLAEADContext::MaxOverhead(this);
    local_30 = (SSL *)(sVar3 + sVar4);
    bVar1 = use_dtls13_record_header(ssl,epoch);
    if (bVar1) {
      local_30 = (SSL *)((long)&local_30->method + 1);
    }
    ssl_local = local_30;
  }
  return (size_t)ssl_local;
}

Assistant:

size_t dtls_max_seal_overhead(const SSL *ssl, uint16_t epoch) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t ret = dtls_record_header_write_len(ssl, epoch) +
               write_epoch->aead->MaxOverhead();
  if (use_dtls13_record_header(ssl, epoch)) {
    // Add 1 byte for the encrypted record type.
    ret++;
  }
  return ret;
}